

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potpourri.cpp
# Opt level: O2

void shared_ownership2(shared_ptr<A> *s_ptr)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Took ownership of: ");
  poVar1 = operator<<(poVar1,(s_ptr->super___shared_ptr<A,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<((ostream *)&std::cout,"use_count: ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void shared_ownership2(std::shared_ptr<A> s_ptr)
{
    std::cout << "Took ownership of: " << *s_ptr << '\n';
    std::cout << "use_count: " << s_ptr.use_count() << '\n';
}